

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void fight_prog_cankerworm(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = is_worn(obj);
  if (bVar1) {
    iVar2 = number_percent();
    if (iVar2 < 10) {
      iVar2 = dice((int)ch->level,3);
      act("The Cankerworm leaps from your hands momentarily!",ch,(void *)0x0,(void *)0x0,3);
      act("The Cankerworm seems to leap from $n\'s hands momentarily!",ch,(void *)0x0,(void *)0x0,0)
      ;
      damage_new(ch,ch->fighting,iVar2,-1,3,true,false,0,1,"burrowing axe");
    }
  }
  return;
}

Assistant:

void fight_prog_cankerworm(OBJ_DATA *obj, CHAR_DATA *ch)
{
	int dam;

	if (!is_worn(obj))
		return;

	if (number_percent() < 10)
	{
		dam = dice((ch->level), 3);
		act("The Cankerworm leaps from your hands momentarily!", ch, 0, 0, TO_CHAR);
		act("The Cankerworm seems to leap from $n's hands momentarily!", ch, 0, 0, TO_ROOM);
		damage_new(ch, ch->fighting, dam, TYPE_UNDEFINED, DAM_SLASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "burrowing axe");
	}
}